

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS
ref_cell_id_list_around(REF_CELL ref_cell,REF_INT node,REF_INT max_ids,REF_INT *n_ids,REF_INT *ids)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  REF_INT nodes [27];
  REF_INT local_a8 [30];
  
  *n_ids = 0;
  uVar4 = 0;
  if (((-1 < node) && (pRVar1 = ref_cell->ref_adj, node < pRVar1->nnode)) &&
     (lVar6 = (long)pRVar1->first[(uint)node], lVar6 != -1)) {
    uVar4 = ref_cell_nodes(ref_cell,pRVar1->item[lVar6].ref,local_a8);
    if (uVar4 == 0) {
      uVar7 = 0;
      do {
        if ((int)uVar7 < 1) {
LAB_001698c9:
          if (max_ids <= (int)uVar7) {
            return 7;
          }
          ids[(int)uVar7] = local_a8[ref_cell->node_per];
          uVar7 = *n_ids + 1;
          *n_ids = uVar7;
        }
        else {
          uVar5 = 0;
          bVar3 = false;
          do {
            if (local_a8[ref_cell->node_per] == ids[uVar5]) {
              bVar3 = true;
            }
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
          if (!bVar3) goto LAB_001698c9;
        }
        pRVar2 = ref_cell->ref_adj->item;
        lVar6 = (long)pRVar2[(int)lVar6].next;
        if (lVar6 == -1) {
          return 0;
        }
        uVar4 = ref_cell_nodes(ref_cell,pRVar2[lVar6].ref,local_a8);
      } while (uVar4 == 0);
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x4fc,
           "ref_cell_id_list_around",(ulong)uVar4,"nodes");
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cell_id_list_around(REF_CELL ref_cell, REF_INT node,
                                           REF_INT max_ids, REF_INT *n_ids,
                                           REF_INT *ids) {
  REF_INT item, cell, id, deg;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL already_have_it;

  *n_ids = 0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    already_have_it = REF_FALSE;
    for (deg = 0; deg < *n_ids; deg++)
      if (id == ids[deg]) already_have_it = REF_TRUE;
    if (!already_have_it) {
      if (*n_ids >= max_ids) {
        return REF_INCREASE_LIMIT;
      }
      ids[*n_ids] = id;
      (*n_ids)++;
    }
  }

  return REF_SUCCESS;
}